

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::internal::
parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&>
          (internal *this,basic_string_view<char> format_str,
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *handler)

{
  internal *end;
  ulong uVar1;
  basic_buffer<char> *pbVar2;
  size_t sVar3;
  internal *piVar4;
  void *pvVar5;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *this_00;
  char *message;
  internal *end_00;
  basic_buffer<char> *c;
  size_t __n;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_58;
  type local_48;
  
  this_00 = (format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             *)format_str.size_;
  if (format_str.data_ != (char *)0x0) {
    end_00 = (internal *)(format_str.data_ + (long)this);
    do {
      piVar4 = this;
      if (*this != (internal)0x7b) {
        __n = (long)end_00 - (long)this;
        if ((long)__n < 0) goto LAB_00189c19;
        piVar4 = (internal *)memchr(this,0x7b,__n);
        if (piVar4 == (internal *)0x0) goto LAB_00189bbb;
      }
      if (this != piVar4) {
        while( true ) {
          if ((long)piVar4 - (long)this < 0) goto LAB_00189c19;
          pvVar5 = memchr(this,0x7d,(long)piVar4 - (long)this);
          if (pvVar5 == (void *)0x0) break;
          end = (internal *)((long)pvVar5 + 1);
          if ((end == piVar4) || (*end != (internal)0x7d)) {
            error_handler::on_error((error_handler *)this_00,"unmatched \'}\' in format string");
          }
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ::on_text(this_00,(char *)this,(char *)end);
          this = (internal *)((long)pvVar5 + 2);
        }
        format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::on_text(this_00,(char *)this,(char *)piVar4);
      }
      piVar4 = piVar4 + 1;
      if (piVar4 == end_00) {
        message = "invalid format string";
        goto LAB_00189c02;
      }
      if (*piVar4 == (internal)0x7b) {
        pbVar2 = (this_00->context).
                 super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                 .out_.container;
        sVar3 = pbVar2->size_;
        uVar1 = sVar3 + 1;
        if (pbVar2->capacity_ < uVar1) {
          (**pbVar2->_vptr_basic_buffer)(pbVar2,uVar1);
        }
        pbVar2->size_ = uVar1;
        *(internal *)(pbVar2->ptr_ + sVar3) = *piVar4;
        (this_00->context).
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
        .out_.container = pbVar2;
      }
      else {
        if (*piVar4 != (internal)0x7d) {
          local_58._0_8_ = this_00;
          piVar4 = (internal *)
                   parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
                             ((char *)piVar4,(char *)end_00,
                              (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
                               *)&local_58.string);
          if (piVar4 != end_00) {
            if (*piVar4 == (internal)0x3a) {
              piVar4 = (internal *)
                       format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                       ::on_format_specs(this_00,(char *)(piVar4 + 1),(char *)end_00);
              if ((piVar4 != end_00) && (*piVar4 == (internal)0x7d)) goto LAB_00189b7f;
              message = "unknown format specifier";
              goto LAB_00189c02;
            }
            if (*piVar4 == (internal)0x7d) goto LAB_00189b50;
          }
          message = "missing \'}\' in format string";
          goto LAB_00189c02;
        }
        basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
        ::next_arg((format_arg *)&local_58.string,&this_00->context);
        (this_00->arg).type_ = local_48;
        (this_00->arg).value_.field_0.long_long_value = local_58.long_long_value;
        (this_00->arg).value_.field_0.string.size = local_58.string.size;
LAB_00189b50:
        format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ::on_replacement_field(this_00,(char *)piVar4);
      }
LAB_00189b7f:
      this = piVar4 + 1;
    } while (this != end_00);
  }
  return;
LAB_00189bbb:
  pvVar5 = memchr(this,0x7d,__n);
  if (pvVar5 == (void *)0x0) {
    format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::on_text(this_00,(char *)this,(char *)end_00);
    return;
  }
  piVar4 = (internal *)((long)pvVar5 + 1);
  if ((piVar4 == end_00) || (*piVar4 != (internal)0x7d)) {
    message = "unmatched \'}\' in format string";
LAB_00189c02:
    error_handler::on_error((error_handler *)this_00,message);
  }
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::on_text(this_00,(char *)this,(char *)piVar4);
  this = (internal *)((long)pvVar5 + 2);
  __n = (long)end_00 - (long)this;
  if ((long)__n < 0) {
LAB_00189c19:
    __assert_fail("(value >= 0) && \"negative value\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/core.h"
                  ,0xd1,
                  "typename std::make_unsigned<Int>::type fmt::internal::to_unsigned(Int) [Int = long]"
                 );
  }
  goto LAB_00189bbb;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      if (begin == end) return;
      for (;;) {
        const Char *p = FMT_NULL;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char *p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end)
      return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}